

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O0

void __thiscall
rigtorp::mpmc::
Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
::emplace<std::unique_ptr<int,std::default_delete<int>>>
          (Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
           *this,unique_ptr<int,_std::default_delete<int>_> *args)

{
  long lVar1;
  Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
  *pQVar2;
  size_t sVar3;
  Slot<std::unique_ptr<int,std::default_delete<int>>> *this_00;
  size_t sVar4;
  Slot<std::unique_ptr<int,_std::default_delete<int>_>_> *slot;
  __int_type_conflict head;
  unique_ptr<int,_std::default_delete<int>_> *args_local;
  Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
  *this_local;
  memory_order __b;
  memory_order __b_1;
  
  pQVar2 = this + 0x40;
  LOCK();
  sVar4 = *(size_t *)pQVar2;
  *(size_t *)pQVar2 = *(size_t *)pQVar2 + 1;
  UNLOCK();
  lVar1 = *(long *)(this + 8);
  sVar3 = Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
          ::idx((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                 *)this,sVar4);
  this_00 = (Slot<std::unique_ptr<int,std::default_delete<int>>> *)(lVar1 + sVar3 * 0x40);
  do {
    sVar3 = Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
            ::turn((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                    *)this,sVar4);
    std::operator&(memory_order_acquire,__memory_order_mask);
  } while (sVar3 * 2 != *(long *)this_00);
  Slot<std::unique_ptr<int,std::default_delete<int>>>::
  construct<std::unique_ptr<int,std::default_delete<int>>>(this_00,args);
  sVar4 = Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
          ::turn((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                  *)this,sVar4);
  std::operator&(memory_order_release,__memory_order_mask);
  *(size_t *)this_00 = sVar4 * 2 + 1;
  return;
}

Assistant:

void emplace(Args &&...args) noexcept {
    static_assert(std::is_nothrow_constructible<T, Args &&...>::value,
                  "T must be nothrow constructible with Args&&...");
    auto const head = head_.fetch_add(1);
    auto &slot = slots_[idx(head)];
    while (turn(head) * 2 != slot.turn.load(std::memory_order_acquire))
      ;
    slot.construct(std::forward<Args>(args)...);
    slot.turn.store(turn(head) * 2 + 1, std::memory_order_release);
  }